

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btShapeHull.cpp
# Opt level: O1

bool __thiscall btShapeHull::buildHull(btShapeHull *this,btScalar param_1)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  btConvexShape *pbVar4;
  btVector3 *ptr;
  uint *puVar5;
  undefined8 uVar6;
  uint uVar7;
  uint uVar8;
  HullError HVar9;
  btVector3 *pbVar10;
  uint *puVar11;
  long lVar12;
  long lVar13;
  int i;
  uint uVar14;
  long lVar15;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined8 in_XMM1_Qa;
  HullResult hr;
  HullLibrary hl;
  HullDesc hd;
  btVector3 supportPoints [62];
  HullResult local_4c8;
  HullLibrary local_478;
  HullDesc local_438;
  btVector3 local_418 [62];
  
  uVar8 = (*(this->m_shape->super_btCollisionShape)._vptr_btCollisionShape[0x15])();
  if ((int)uVar8 < 1) {
    uVar14 = 0x2a;
  }
  else {
    pbVar10 = getUnitSpherePoints::sUnitSpherePoints + 0x2a;
    uVar7 = 0;
    do {
      uVar14 = uVar7;
      (*(this->m_shape->super_btCollisionShape)._vptr_btCollisionShape[0x16])
                (this->m_shape,(ulong)uVar14,local_418);
      getUnitSpherePoints();
      *(undefined8 *)pbVar10->m_floats = local_418[0].m_floats._0_8_;
      *(undefined8 *)(pbVar10->m_floats + 2) = local_418[0].m_floats._8_8_;
      pbVar10 = pbVar10 + 1;
      uVar7 = uVar14 + 1;
    } while (uVar8 != uVar14 + 1);
    uVar14 = uVar14 + 0x2b;
  }
  lVar15 = 0;
  do {
    pbVar4 = this->m_shape;
    getUnitSpherePoints();
    (*(pbVar4->super_btCollisionShape)._vptr_btCollisionShape[0x10])
              (pbVar4,(long)getUnitSpherePoints::sUnitSpherePoints[0].m_floats + lVar15);
    *(undefined4 *)((long)local_418[0].m_floats + lVar15) = extraout_XMM0_Da;
    *(undefined4 *)((long)local_418[0].m_floats + lVar15 + 4) = extraout_XMM0_Db;
    *(int *)((long)local_418[0].m_floats + lVar15 + 8) = (int)in_XMM1_Qa;
    *(int *)((long)local_418[0].m_floats + lVar15 + 0xc) = (int)((ulong)in_XMM1_Qa >> 0x20);
    lVar15 = lVar15 + 0x10;
  } while ((ulong)uVar14 << 4 != lVar15);
  local_438.mFlags = 1;
  local_438.mVertexStride = 0x10;
  local_438.mNormalEpsilon = 0.001;
  local_438.mMaxVertices = 0x1000;
  local_438.mMaxFaces = 0x1000;
  local_438.mVertices = local_418;
  local_478.m_tris.m_ownsMemory = true;
  local_478.m_tris.m_data = (btHullTriangle **)0x0;
  local_478.m_tris.m_size = 0;
  local_478.m_tris.m_capacity = 0;
  local_478.m_vertexIndexMapping.m_ownsMemory = true;
  local_478.m_vertexIndexMapping.m_data = (int *)0x0;
  local_478.m_vertexIndexMapping.m_size = 0;
  local_478.m_vertexIndexMapping.m_capacity = 0;
  local_4c8.m_OutputVertices.m_ownsMemory = true;
  local_4c8.m_OutputVertices.m_data = (btVector3 *)0x0;
  local_4c8.m_OutputVertices.m_size = 0;
  local_4c8.m_OutputVertices.m_capacity = 0;
  local_4c8.m_Indices.m_ownsMemory = true;
  local_4c8.m_Indices.m_data = (uint *)0x0;
  local_4c8.m_Indices.m_size = 0;
  local_4c8.m_Indices.m_capacity = 0;
  local_4c8.mPolygons = true;
  local_4c8.mNumOutputVertices = 0;
  local_4c8.mNumFaces = 0;
  local_4c8.mNumIndices = 0;
  local_438.mVcount = uVar14;
  HVar9 = HullLibrary::CreateConvexHull(&local_478,&local_438,&local_4c8);
  uVar8 = local_4c8.mNumOutputVertices;
  if (HVar9 != QE_FAIL) {
    if (((this->m_vertices).m_size < (int)local_4c8.mNumOutputVertices) &&
       ((this->m_vertices).m_capacity < (int)local_4c8.mNumOutputVertices)) {
      if (local_4c8.mNumOutputVertices == 0) {
        pbVar10 = (btVector3 *)0x0;
      }
      else {
        pbVar10 = (btVector3 *)
                  btAlignedAllocInternal((long)(int)local_4c8.mNumOutputVertices << 4,0x10);
      }
      lVar15 = (long)(this->m_vertices).m_size;
      if (0 < lVar15) {
        lVar12 = 0;
        do {
          puVar1 = (undefined8 *)((long)((this->m_vertices).m_data)->m_floats + lVar12);
          uVar6 = puVar1[1];
          puVar2 = (undefined8 *)((long)pbVar10->m_floats + lVar12);
          *puVar2 = *puVar1;
          puVar2[1] = uVar6;
          lVar12 = lVar12 + 0x10;
        } while (lVar15 * 0x10 != lVar12);
      }
      ptr = (this->m_vertices).m_data;
      if (ptr != (btVector3 *)0x0) {
        if ((this->m_vertices).m_ownsMemory == true) {
          btAlignedFreeInternal(ptr);
        }
        (this->m_vertices).m_data = (btVector3 *)0x0;
      }
      (this->m_vertices).m_ownsMemory = true;
      (this->m_vertices).m_data = pbVar10;
      (this->m_vertices).m_capacity = uVar8;
    }
    (this->m_vertices).m_size = uVar8;
    if (0 < (int)local_4c8.mNumOutputVertices) {
      lVar15 = 0;
      lVar12 = 0;
      do {
        puVar1 = (undefined8 *)((long)(local_4c8.m_OutputVertices.m_data)->m_floats + lVar15);
        uVar6 = puVar1[1];
        puVar2 = (undefined8 *)((long)((this->m_vertices).m_data)->m_floats + lVar15);
        *puVar2 = *puVar1;
        puVar2[1] = uVar6;
        lVar12 = lVar12 + 1;
        lVar15 = lVar15 + 0x10;
      } while (lVar12 < (int)local_4c8.mNumOutputVertices);
    }
    uVar8 = local_4c8.mNumIndices;
    this->m_numIndices = local_4c8.mNumIndices;
    iVar3 = (this->m_indices).m_size;
    if ((iVar3 <= (int)local_4c8.mNumIndices) && (iVar3 < (int)local_4c8.mNumIndices)) {
      lVar15 = (long)(int)local_4c8.mNumIndices;
      if ((this->m_indices).m_capacity < (int)local_4c8.mNumIndices) {
        if (local_4c8.mNumIndices == 0) {
          puVar11 = (uint *)0x0;
        }
        else {
          puVar11 = (uint *)btAlignedAllocInternal(lVar15 * 4,0x10);
        }
        lVar12 = (long)(this->m_indices).m_size;
        if (0 < lVar12) {
          puVar5 = (this->m_indices).m_data;
          lVar13 = 0;
          do {
            puVar11[lVar13] = puVar5[lVar13];
            lVar13 = lVar13 + 1;
          } while (lVar12 != lVar13);
        }
        puVar5 = (this->m_indices).m_data;
        if (puVar5 != (uint *)0x0) {
          if ((this->m_indices).m_ownsMemory == true) {
            btAlignedFreeInternal(puVar5);
          }
          (this->m_indices).m_data = (uint *)0x0;
        }
        (this->m_indices).m_ownsMemory = true;
        (this->m_indices).m_data = puVar11;
        (this->m_indices).m_capacity = uVar8;
      }
      if (iVar3 < (int)uVar8) {
        memset((this->m_indices).m_data + iVar3,0,(lVar15 - iVar3) * 4);
      }
    }
    (this->m_indices).m_size = uVar8;
    if (0 < (int)this->m_numIndices) {
      puVar11 = (this->m_indices).m_data;
      lVar15 = 0;
      do {
        puVar11[lVar15] = local_4c8.m_Indices.m_data[lVar15];
        lVar15 = lVar15 + 1;
      } while (lVar15 < (int)this->m_numIndices);
    }
    HullLibrary::ReleaseResult(&local_478,&local_4c8);
  }
  btAlignedObjectArray<unsigned_int>::~btAlignedObjectArray(&local_4c8.m_Indices);
  btAlignedObjectArray<btVector3>::~btAlignedObjectArray(&local_4c8.m_OutputVertices);
  btAlignedObjectArray<int>::~btAlignedObjectArray(&local_478.m_vertexIndexMapping);
  btAlignedObjectArray<btHullTriangle_*>::~btAlignedObjectArray(&local_478.m_tris);
  return HVar9 != QE_FAIL;
}

Assistant:

bool
btShapeHull::buildHull (btScalar /*margin*/)
{
	int numSampleDirections = NUM_UNITSPHERE_POINTS;
	{
		int numPDA = m_shape->getNumPreferredPenetrationDirections();
		if (numPDA)
		{
			for (int i=0;i<numPDA;i++)
			{
				btVector3 norm;
				m_shape->getPreferredPenetrationDirection(i,norm);
				getUnitSpherePoints()[numSampleDirections] = norm;
				numSampleDirections++;
			}
		}
	}

	btVector3 supportPoints[NUM_UNITSPHERE_POINTS+MAX_PREFERRED_PENETRATION_DIRECTIONS*2];
	int i;
	for (i = 0; i < numSampleDirections; i++)
	{
		supportPoints[i] = m_shape->localGetSupportingVertex(getUnitSpherePoints()[i]);
	}

	HullDesc hd;
	hd.mFlags = QF_TRIANGLES;
	hd.mVcount = static_cast<unsigned int>(numSampleDirections);

#ifdef BT_USE_DOUBLE_PRECISION
	hd.mVertices = &supportPoints[0];
	hd.mVertexStride = sizeof(btVector3);
#else
	hd.mVertices = &supportPoints[0];
	hd.mVertexStride = sizeof (btVector3);
#endif

	HullLibrary hl;
	HullResult hr;
	if (hl.CreateConvexHull (hd, hr) == QE_FAIL)
	{
		return false;
	}

	m_vertices.resize (static_cast<int>(hr.mNumOutputVertices));


	for (i = 0; i < static_cast<int>(hr.mNumOutputVertices); i++)
	{
		m_vertices[i] = hr.m_OutputVertices[i];
	}
	m_numIndices = hr.mNumIndices;
	m_indices.resize(static_cast<int>(m_numIndices));
	for (i = 0; i < static_cast<int>(m_numIndices); i++)
	{
		m_indices[i] = hr.m_Indices[i];
	}

	// free temporary hull result that we just copied
	hl.ReleaseResult (hr);

	return true;
}